

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTChannel.cpp
# Opt level: O1

bool __thiscall
LTACMasterdataChannel::UpdateStaticData
          (LTACMasterdataChannel *this,FDKeyTy *keyAc,FDStaticData *dat)

{
  int iVar1;
  iterator iVar2;
  bool bVar3;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&mapFdMutex);
  if (iVar1 == 0) {
    iVar2 = std::
            _Rb_tree<LTFlightData::FDKeyTy,_std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>,_std::_Select1st<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
            ::find(&mapFd._M_t,keyAc);
    bVar3 = (_Rb_tree_header *)iVar2._M_node != &mapFd._M_t._M_impl.super__Rb_tree_header;
    if (bVar3) {
      LTFlightData::UpdateData
                ((LTFlightData *)&iVar2._M_node[2]._M_left,dat,NAN,(this->currRequ).type);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&mapFdMutex);
    return bVar3;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

bool LTACMasterdataChannel::UpdateStaticData (const LTFlightData::FDKeyTy& keyAc,
                                              const LTFlightData::FDStaticData& dat)
{
    // Find and update respective flight data
    try {
        // from here on access to fdMap guarded by a mutex
        std::lock_guard<std::mutex> mapFdLock (mapFdMutex);
        
        // get the fd object from the map, key is the transpIcao
        mapLTFlightDataTy::iterator fdIter = mapFd.find(keyAc);
        if (fdIter == mapFd.end())
            return false;                   // not found
        
        // do the actual update
        fdIter->second.UpdateData(dat, NAN, currRequ.type);
        return true;
        
    } catch(const std::system_error& e) {
        LOG_MSG(logERR, ERR_LOCK_ERROR, "mapFd", e.what());
    }
    
    // must have caught an error
    return false;
}